

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  bool bVar1;
  OfType type;
  string local_2b0 [32];
  string local_290;
  SourceLineInfo local_270;
  string local_248;
  undefined1 local_228 [8];
  MessageBuilder builder;
  Totals *_totals_local;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages_local;
  AssertionResult *_assertionResult_local;
  AssertionStats *this_local;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00221838;
  AssertionResult::AssertionResult(&this->assertionResult,_assertionResult);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  memcpy(&this->totals,_totals,0x30);
  bVar1 = AssertionResult::hasMessage(&this->assertionResult);
  if (bVar1) {
    AssertionResult::getTestMacroName_abi_cxx11_(&local_248,&this->assertionResult);
    AssertionResult::getSourceInfo(&local_270,&this->assertionResult);
    type = AssertionResult::getResultType(&this->assertionResult);
    MessageBuilder::MessageBuilder((MessageBuilder *)local_228,&local_248,&local_270,type);
    SourceLineInfo::~SourceLineInfo(&local_270);
    std::__cxx11::string::~string((string *)&local_248);
    AssertionResult::getMessage_abi_cxx11_(&local_290,&this->assertionResult);
    MessageBuilder::operator<<((MessageBuilder *)local_228,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&builder.m_info.type,local_2b0);
    std::__cxx11::string::~string(local_2b0);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)local_228);
    MessageBuilder::~MessageBuilder((MessageBuilder *)local_228);
  }
  return;
}

Assistant:

AssertionStats( AssertionResult const& _assertionResult,
                        std::vector<MessageInfo> const& _infoMessages,
                        Totals const& _totals )
        :   assertionResult( _assertionResult ),
            infoMessages( _infoMessages ),
            totals( _totals )
        {
            if( assertionResult.hasMessage() ) {
                // Copy message into messages list.
                // !TBD This should have been done earlier, somewhere
                MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
                builder << assertionResult.getMessage();
                builder.m_info.message = builder.m_stream.str();

                infoMessages.push_back( builder.m_info );
            }
        }